

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool intersect_skewed_uint16_nonempty(uint16_t *small,size_t size_s,uint16_t *large,size_t size_l)

{
  int32_t iVar1;
  long in_RCX;
  uint16_t *in_RDX;
  long in_RSI;
  ushort *in_RDI;
  uint16_t val_s;
  uint16_t val_l;
  size_t idx_s;
  size_t idx_l;
  ushort local_3c;
  ushort local_3a;
  long local_38;
  long local_30;
  
  local_30 = 0;
  local_38 = 0;
  if (in_RSI != 0) {
    local_3a = *in_RDX;
    local_3c = *in_RDI;
    while( true ) {
      while (local_3c <= local_3a) {
        if (local_3a <= local_3c) {
          return true;
        }
        local_38 = local_38 + 1;
        if (local_38 == in_RSI) {
          return false;
        }
        local_3c = in_RDI[local_38];
      }
      iVar1 = advanceUntil(in_RDX,(int32_t)local_30,(int32_t)in_RCX,local_3c);
      local_30 = (long)iVar1;
      if (local_30 == in_RCX) break;
      local_3a = in_RDX[local_30];
    }
  }
  return false;
}

Assistant:

bool intersect_skewed_uint16_nonempty(const uint16_t *small, size_t size_s,
                                      const uint16_t *large, size_t size_l) {
    size_t idx_l = 0, idx_s = 0;

    if (0 == size_s) {
        return false;
    }

    uint16_t val_l = large[idx_l], val_s = small[idx_s];

    while (true) {
        if (val_l < val_s) {
            idx_l = advanceUntil(large, (int32_t)idx_l, (int32_t)size_l, val_s);
            if (idx_l == size_l) break;
            val_l = large[idx_l];
        } else if (val_s < val_l) {
            idx_s++;
            if (idx_s == size_s) break;
            val_s = small[idx_s];
        } else {
            return true;
        }
    }

    return false;
}